

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O3

Matrix<double,_2,_3> * gl4cts::Math::transpose<double,3,2>(Matrix<double,_3,_2> *matrix)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  Matrix<double,_2,_3> *res;
  bool bVar3;
  Matrix<double,_2,_3> *result;
  long lVar4;
  long lVar5;
  undefined1 auVar6 [16];
  bool bVar8;
  undefined8 uVar9;
  long lVar7;
  
  (res->m_data).m_data[2].m_data[0] = 0.0;
  (res->m_data).m_data[2].m_data[1] = 0.0;
  (res->m_data).m_data[1].m_data[0] = 0.0;
  (res->m_data).m_data[1].m_data[1] = 0.0;
  (res->m_data).m_data[0].m_data[0] = 0.0;
  (res->m_data).m_data[0].m_data[1] = 0.0;
  auVar2 = _DAT_019f34d0;
  auVar1 = _DAT_019ec5b0;
  lVar4 = 0;
  bVar8 = true;
  do {
    bVar3 = bVar8;
    lVar5 = 0;
    auVar6 = auVar2;
    do {
      bVar8 = SUB164(auVar6 ^ auVar1,4) == -0x80000000 && SUB164(auVar6 ^ auVar1,0) < -0x7ffffffd;
      if (bVar8) {
        uVar9 = 0x3ff0000000000000;
        if (lVar4 * 0x10 != lVar5) {
          uVar9 = 0;
        }
        *(undefined8 *)((long)(res->m_data).m_data[0].m_data + lVar5 + lVar4 * 8) = uVar9;
      }
      if (bVar8) {
        uVar9 = 0x3ff0000000000000;
        if (lVar4 * 0x10 + -0x10 != lVar5) {
          uVar9 = 0;
        }
        *(undefined8 *)((long)(res->m_data).m_data[1].m_data + lVar5 + lVar4 * 8) = uVar9;
      }
      lVar7 = auVar6._8_8_;
      auVar6._0_8_ = auVar6._0_8_ + 2;
      auVar6._8_8_ = lVar7 + 2;
      lVar5 = lVar5 + 0x20;
    } while (lVar5 != 0x40);
    lVar4 = 1;
    bVar8 = false;
  } while (bVar3);
  lVar4 = 0;
  do {
    *(undefined8 *)((long)(res->m_data).m_data[0].m_data + lVar4 * 2) =
         *(undefined8 *)((long)(matrix->m_data).m_data[0].m_data + lVar4);
    *(undefined8 *)((long)(res->m_data).m_data[0].m_data + lVar4 * 2 + 8) =
         *(undefined8 *)((long)(matrix->m_data).m_data[1].m_data + lVar4);
    lVar4 = lVar4 + 8;
  } while (lVar4 != 0x18);
  return res;
}

Assistant:

static tcu::Matrix<T, Cols, Rows> transpose(const tcu::Matrix<T, Rows, Cols>& matrix)
{
	tcu::Matrix<T, Cols, Rows> result = tcu::transpose(matrix);

	return result;
}